

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot.cpp
# Opt level: O0

ImPlotTime ImPlot::CombineDateTime(ImPlotTime *date_part,ImPlotTime *tod_part)

{
  int iVar1;
  int iVar2;
  int iVar3;
  ImPlotContext *pIVar4;
  tm *ptm;
  ImPlotTime IVar5;
  int d;
  int m;
  int y;
  tm *Tm;
  ImPlotTime *tod_part_local;
  ImPlotTime *date_part_local;
  ImPlotTime t;
  
  pIVar4 = GImPlot;
  ptm = &GImPlot->Tm;
  GetTime(date_part,&GImPlot->Tm);
  iVar1 = (pIVar4->Tm).tm_year;
  iVar2 = (pIVar4->Tm).tm_mon;
  iVar3 = (pIVar4->Tm).tm_mday;
  GetTime(tod_part,&GImPlot->Tm);
  (pIVar4->Tm).tm_year = iVar1;
  (pIVar4->Tm).tm_mon = iVar2;
  (pIVar4->Tm).tm_mday = iVar3;
  IVar5 = MkTime(ptm);
  IVar5.Us = tod_part->Us;
  IVar5._12_4_ = 0;
  return IVar5;
}

Assistant:

ImPlotTime CombineDateTime(const ImPlotTime& date_part, const ImPlotTime& tod_part) {
    tm& Tm = GImPlot->Tm;
    GetTime(date_part, &GImPlot->Tm);
    int y = Tm.tm_year;
    int m = Tm.tm_mon;
    int d = Tm.tm_mday;
    GetTime(tod_part, &GImPlot->Tm);
    Tm.tm_year = y;
    Tm.tm_mon  = m;
    Tm.tm_mday = d;
    ImPlotTime t = MkTime(&Tm);
    t.Us = tod_part.Us;
    return t;
}